

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_pps.c
# Opt level: O0

MPP_RET process_prefix(H264_SLICE_t *currSlice)

{
  MPP_RET MVar1;
  RK_S32 local_3c;
  h264_prefix_t *phStack_38;
  RK_S32 _out;
  H264_PREFIX_t *cur_prefix;
  BitReadCtx_t *p_bitctx;
  H264dCurCtx_t *p_Cur;
  H264_SLICE_t *pHStack_18;
  MPP_RET ret;
  H264_SLICE_t *currSlice_local;
  
  p_Cur._4_4_ = 0xfffffffe;
  p_bitctx = (BitReadCtx_t *)currSlice->p_Cur;
  cur_prefix = (H264_PREFIX_t *)&((h264d_cur_ctx_t *)p_bitctx)->bitctx;
  phStack_38 = &((h264d_cur_ctx_t *)p_bitctx)->prefix;
  if (currSlice->nal_reference_idc != 0) {
    pHStack_18 = currSlice;
    MVar1 = mpp_read_bits((BitReadCtx_t *)cur_prefix,1,&local_3c);
    cur_prefix[2].store_ref_base_pic_flag = MVar1;
    if (cur_prefix[2].store_ref_base_pic_flag != 0) {
      return cur_prefix[2].store_ref_base_pic_flag;
    }
    phStack_38->store_ref_base_pic_flag = local_3c;
    if (((((pHStack_18->svcExt).use_ref_base_pic_flag != 0) ||
         (phStack_38->store_ref_base_pic_flag != 0)) && ((pHStack_18->svcExt).idr_flag == 0)) &&
       ((h264d_debug & 8) != 0)) {
      _mpp_log_l(4,"h264d_pps","read dec_ref_base_pic_marking\n",(char *)0x0);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET process_prefix(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    H264_PREFIX_t *cur_prefix = &p_Cur->prefix;

    if (currSlice->nal_reference_idc) {
        READ_ONEBIT(p_bitctx, &cur_prefix->store_ref_base_pic_flag);

        if ((currSlice->svcExt.use_ref_base_pic_flag ||
             cur_prefix->store_ref_base_pic_flag) &&
            !currSlice->svcExt.idr_flag) {
            H264D_LOG("read dec_ref_base_pic_marking\n");
        }
    }

    return ret = MPP_OK;
__BITREAD_ERR:
    return p_bitctx->ret;
}